

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O2

QPDFObjectHandle
QPDFPageLabelDocumentHelper::pageLabelDict
          (qpdf_page_label_e label_type,int start_num,string_view prefix)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined4 in_register_0000003c;
  element_type *this;
  QPDFObjectHandle QVar2;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff88;
  string local_60;
  QPDFObjectHandle local_40;
  string_view prefix_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this = (element_type *)CONCAT44(in_register_0000003c,label_type);
  prefix_local._M_len = (size_t)prefix._M_str;
  QVar2 = QPDFObjectHandle::newDictionary();
  _Var1._M_pi = QVar2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  switch(start_num) {
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/S",(allocator<char> *)&local_40);
    operator____qpdf((char *)local_80,0x228339);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,(QPDFObjectHandle *)local_80);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/S",(allocator<char> *)&local_40);
    operator____qpdf((char *)local_80,0x2284f3);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,(QPDFObjectHandle *)local_80);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/S",(allocator<char> *)&local_40);
    operator____qpdf((char *)local_80,0x2283b5);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,(QPDFObjectHandle *)local_80);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/S",(allocator<char> *)&local_40);
    operator____qpdf((char *)local_80,0x2284f6);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,(QPDFObjectHandle *)local_80);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/S",(allocator<char> *)&local_40);
    operator____qpdf((char *)local_80,0x2284f9);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,(QPDFObjectHandle *)local_80);
    break;
  default:
    goto switchD_001a54ed_default;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&local_60);
  _Var1._M_pi = extraout_RDX;
switchD_001a54ed_default:
  if (prefix._M_str != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/P",&local_81);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_80,&prefix_local,&local_82);
    QPDFObjectHandle::newUnicodeString(&local_40,(string *)local_80);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)&local_60);
    _Var1._M_pi = extraout_RDX_00;
  }
  if ((int)prefix._M_len != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/St",(allocator<char> *)&local_40);
    QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffff88._M_pi);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_60,(QPDFObjectHandle *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string((string *)&local_60);
    _Var1._M_pi = extraout_RDX_01;
  }
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageLabelDocumentHelper::pageLabelDict(
    qpdf_page_label_e label_type, int start_num, std::string_view prefix)
{
    auto num = QPDFObjectHandle::newDictionary();
    switch (label_type) {
    case pl_none:
        break;
    case pl_digits:
        num.replaceKey("/S", "/D"_qpdf);
        break;
    case pl_alpha_lower:
        num.replaceKey("/S", "/a"_qpdf);
        break;
    case pl_alpha_upper:
        num.replaceKey("/S", "/A"_qpdf);
        break;
    case pl_roman_lower:
        num.replaceKey("/S", "/r"_qpdf);
        break;
    case pl_roman_upper:
        num.replaceKey("/S", "/R"_qpdf);
        break;
    }
    if (!prefix.empty()) {
        num.replaceKey("/P", QPDFObjectHandle::newUnicodeString(std::string(prefix)));
    }
    if (start_num != 1) {
        num.replaceKey("/St", QPDFObjectHandle::newInteger(start_num));
    }
    return num;
}